

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElDisc.cpp
# Opt level: O2

void __thiscall TPZCompElDisc::TPZCompElDisc(TPZCompElDisc *this)

{
  double local_38;
  
  *(undefined ***)&(this->super_TPZInterpolationSpace).super_TPZCompEl = &PTR__TPZSavable_0177a578;
  TPZInterpolationSpace::TPZInterpolationSpace(&this->super_TPZInterpolationSpace,&PTR_PTR_01779ec0)
  ;
  *(undefined ***)&(this->super_TPZInterpolationSpace).super_TPZCompEl =
       &PTR__TPZCompElDisc_01779b50;
  TPZAutoPointer<TPZIntPoints>::TPZAutoPointer(&this->fIntRule);
  this->fConnectIndex = -1;
  TPZAutoPointer<TPZFunction<double>_>::TPZAutoPointer(&this->fExternalShape);
  local_38 = 0.0;
  TPZManVector<double,_3>::TPZManVector(&this->fCenterPoint,3,&local_38);
  this->fShapefunctionType = ETensorial;
  TPZAutoPointer<TPZIntPoints>::operator=(&this->fIntRule,(TPZIntPoints *)0x0);
  this->fUseQsiEta = true;
  this->fConstC = 1.0;
  return;
}

Assistant:

TPZCompElDisc::TPZCompElDisc() : TPZRegisterClassId(&TPZCompElDisc::ClassId),
TPZInterpolationSpace(), fConnectIndex(-1), fExternalShape(), fCenterPoint(3,0.)
{
	this->fShapefunctionType = pzshape::TPZShapeDisc::ETensorial;
	this->fIntRule = NULL;
    fUseQsiEta = true;
    fConstC = 1.;

}